

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O0

CharDataOpts __thiscall xercesc_4_0::DTDElementDecl::getCharDataOpts(DTDElementDecl *this)

{
  int iVar1;
  CharDataOpts local_14;
  CharDataOpts retVal;
  DTDElementDecl *this_local;
  
  iVar1 = *(int *)&(this->super_XMLElementDecl).field_0x2c;
  if (iVar1 == 0) {
    local_14 = NoCharData;
  }
  else if (iVar1 == 3) {
    local_14 = SpacesOk;
  }
  else {
    local_14 = AllCharData;
  }
  return local_14;
}

Assistant:

XMLElementDecl::CharDataOpts DTDElementDecl::getCharDataOpts() const
{
    XMLElementDecl::CharDataOpts retVal;
    switch(fModelType)
    {
        case Children :
            retVal = XMLElementDecl::SpacesOk;
            break;

        case Empty :
            retVal = XMLElementDecl::NoCharData;
            break;

        default :
            retVal = XMLElementDecl::AllCharData;
            break;
    }
    return retVal;
}